

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void SkipLine(ConfigScanner *sc)

{
  char firstbyte;
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  
  if (sc != (ConfigScanner *)0x0) {
    pcVar3 = sc->ptr;
    while( true ) {
      firstbyte = *pcVar3;
      sVar1 = GetUTF8Length(firstbyte);
      if (firstbyte == '\0') break;
      if (firstbyte == '\n') {
        lVar2 = 1;
LAB_00142c11:
        sc->ptr = pcVar3 + lVar2;
        return;
      }
      if (firstbyte == '\r') {
        sc->ptr = pcVar3 + 1;
        lVar2 = 2;
        if (pcVar3[1] != '\n') {
          return;
        }
        goto LAB_00142c11;
      }
      if (sVar1 == 0) {
        return;
      }
      pcVar3 = pcVar3 + sVar1;
      sc->ptr = pcVar3;
    }
  }
  return;
}

Assistant:

void SkipLine(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	while (true)
	{
		size_t step = GetUTF8Length(*sc->ptr);
		switch (*sc->ptr)
		{
		case '\0':
			return;
		case '\n':
			sc->ptr++;
			return;
		case '\r':
			sc->ptr++;
			if (*sc->ptr == '\n')
			{
				sc->ptr++;
			}
			return;
		default:
			if (step == 0)
			{
				return;
			}
			sc->ptr += step;
		}
	}
	return;
}